

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

t_emit * __thiscall xemmai::t_emit::operator<<(t_emit *this,double a_operand)

{
  pointer *pppvVar1;
  t_code *ptVar2;
  iterator __position;
  anon_union_8_2_f9ece6e2 anon_var_0;
  void *local_10;
  
  ptVar2 = this->v_code;
  __position._M_current =
       (ptVar2->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (ptVar2->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_10 = (void *)a_operand;
    std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
              ((vector<void*,std::allocator<void*>> *)&ptVar2->v_instructions,__position,&local_10);
  }
  else {
    *__position._M_current = (void *)a_operand;
    pppvVar1 = &(ptVar2->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  return this;
}

Assistant:

t_emit& operator<<(double a_operand)
	{
		union
		{
			double v0;
			void* v1[sizeof(double) / sizeof(void*)];
		};
		v0 = a_operand;
		for (size_t i = 0; i < sizeof(double) / sizeof(void*); ++i) v_code->v_instructions.push_back(v1[i]);
		return *this;
	}